

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

void save_pos_for_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object obj;
  Am_Object scroll_command;
  Am_Object scrollbar;
  Am_Value value;
  Am_Object inter;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value local_28;
  Am_Object local_18;
  
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)command_obj,10);
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_18,10);
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_48,0xc5);
  Am_Object::Am_Object(&local_30,command_obj);
  Am_Object::Am_Object(&local_38,&local_50);
  Am_Object::Am_Object(&local_40,&local_48);
  set_up_for_undo(&local_30,&local_38,&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  local_58.data = (Am_Object_Data *)0x0;
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::operator=(&local_58,&local_50);
  while( true ) {
    in_value = Am_Object::Get(&local_58,0x154,1);
    Am_Value::operator=(&local_28,in_value);
    bVar1 = Am_Value::Valid(&local_28);
    if (!bVar1) break;
    if (local_28.type != 0xa001) goto LAB_00249c31;
    Am_Object::operator=(&local_58,&local_28);
  }
  Am_Object::Set(&local_58,0x154,-2,0);
LAB_00249c31:
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, save_pos_for_undo,
                 (Am_Object command_obj))
{
  Am_Object inter = command_obj.Get_Owner();
  Am_Object scrollbar = inter.Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  set_up_for_undo(command_obj, scroll_command, scrollbar);
  //find the top-level parent and mark it as not queued until the
  //final do action
  Am_Object obj;
  Am_Value value;
  obj = scroll_command;
  while (true) {
    value = obj.Peek(Am_IMPLEMENTATION_PARENT);
    if (value.Valid()) {
      if (value.type != Am_OBJECT)
        break; //already marked as not queued
    } else {   // not valid
      obj.Set(Am_IMPLEMENTATION_PARENT, Am_MARKER_FOR_SCROLL_INC);
      break;
    }
    obj = value;
  }
}